

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_smooth_v_predictor_64x32_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  ushort uVar25;
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  unkuint9 Var29;
  undefined1 auVar30 [11];
  undefined1 auVar31 [13];
  undefined1 auVar32 [15];
  unkuint9 Var33;
  undefined1 auVar34 [11];
  undefined1 auVar35 [15];
  unkuint9 Var36;
  undefined1 auVar37 [11];
  undefined1 auVar38 [13];
  undefined1 auVar39 [15];
  unkuint9 Var40;
  undefined1 auVar41 [11];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  uint uVar50;
  uint8_t *puVar51;
  short sVar52;
  short sVar55;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  ushort uVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  ushort uVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  ushort uVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  ushort uVar98;
  ushort uVar99;
  ushort uVar101;
  ushort uVar102;
  ushort uVar103;
  ushort uVar104;
  ushort uVar105;
  ushort uVar106;
  ushort uVar107;
  ushort uVar108;
  ushort uVar109;
  ushort uVar110;
  ushort uVar111;
  ushort uVar112;
  ushort uVar113;
  ushort uVar114;
  ushort uVar115;
  ushort uVar116;
  ushort uVar117;
  ushort uVar118;
  ushort uVar119;
  ushort uVar120;
  ushort uVar121;
  ushort uVar122;
  undefined1 auVar100 [16];
  short sVar123;
  short sVar124;
  short sVar128;
  short sVar130;
  short sVar132;
  short sVar134;
  short sVar136;
  short sVar138;
  undefined1 auVar125 [16];
  short sVar140;
  undefined1 auVar126 [16];
  short sVar129;
  short sVar131;
  short sVar133;
  short sVar135;
  short sVar137;
  short sVar139;
  short sVar141;
  undefined1 auVar127 [16];
  ushort uVar142;
  ushort uVar143;
  ushort uVar144;
  ushort uVar145;
  ushort uVar146;
  ushort uVar147;
  ushort uVar148;
  ushort uVar149;
  ushort uVar150;
  ushort uVar151;
  ushort uVar152;
  ushort uVar153;
  ushort uVar154;
  ushort uVar155;
  ushort uVar156;
  ushort uVar157;
  ushort uVar158;
  ushort uVar159;
  ushort uVar160;
  ushort uVar161;
  ushort uVar162;
  ushort uVar163;
  ushort uVar164;
  ushort uVar165;
  ushort uVar166;
  ushort uVar167;
  ushort uVar168;
  ushort uVar169;
  ushort uVar170;
  ushort uVar171;
  ushort uVar172;
  ushort uVar173;
  
  auVar54 = _DAT_0050f5e0;
  auVar53 = pshuflw(ZEXT116(left_column[0x1f]),ZEXT116(left_column[0x1f]),0);
  auVar97 = *(undefined1 (*) [16])top_row;
  auVar126 = *(undefined1 (*) [16])(top_row + 0x10);
  auVar100 = *(undefined1 (*) [16])(top_row + 0x20);
  auVar127 = *(undefined1 (*) [16])(top_row + 0x30);
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar97._0_13_;
  auVar4[0xe] = auVar97[7];
  auVar8[0xc] = auVar97[6];
  auVar8._0_12_ = auVar97._0_12_;
  auVar8._13_2_ = auVar4._13_2_;
  auVar12[0xb] = 0;
  auVar12._0_11_ = auVar97._0_11_;
  auVar12._12_3_ = auVar8._12_3_;
  auVar16[10] = auVar97[5];
  auVar16._0_10_ = auVar97._0_10_;
  auVar16._11_4_ = auVar12._11_4_;
  auVar20[9] = 0;
  auVar20._0_9_ = auVar97._0_9_;
  auVar20._10_5_ = auVar16._10_5_;
  auVar24[8] = auVar97[4];
  auVar24._0_8_ = auVar97._0_8_;
  auVar24._9_6_ = auVar20._9_6_;
  auVar28._7_8_ = 0;
  auVar28._0_7_ = auVar24._8_7_;
  Var29 = CONCAT81(SUB158(auVar28 << 0x40,7),auVar97[3]);
  auVar42._9_6_ = 0;
  auVar42._0_9_ = Var29;
  auVar30._1_10_ = SUB1510(auVar42 << 0x30,5);
  auVar30[0] = auVar97[2];
  auVar43._11_4_ = 0;
  auVar43._0_11_ = auVar30;
  auVar31._1_12_ = SUB1512(auVar43 << 0x20,3);
  auVar31[0] = auVar97[1];
  uVar67 = (ushort)auVar97[0];
  uVar56 = (ushort)auVar97[8];
  auVar1[0xd] = 0;
  auVar1._0_13_ = auVar126._0_13_;
  auVar1[0xe] = auVar126[7];
  auVar5[0xc] = auVar126[6];
  auVar5._0_12_ = auVar126._0_12_;
  auVar5._13_2_ = auVar1._13_2_;
  auVar9[0xb] = 0;
  auVar9._0_11_ = auVar126._0_11_;
  auVar9._12_3_ = auVar5._12_3_;
  auVar13[10] = auVar126[5];
  auVar13._0_10_ = auVar126._0_10_;
  auVar13._11_4_ = auVar9._11_4_;
  auVar17[9] = 0;
  auVar17._0_9_ = auVar126._0_9_;
  auVar17._10_5_ = auVar13._10_5_;
  auVar21[8] = auVar126[4];
  auVar21._0_8_ = auVar126._0_8_;
  auVar21._9_6_ = auVar17._9_6_;
  auVar32._7_8_ = 0;
  auVar32._0_7_ = auVar21._8_7_;
  Var33 = CONCAT81(SUB158(auVar32 << 0x40,7),auVar126[3]);
  auVar44._9_6_ = 0;
  auVar44._0_9_ = Var33;
  auVar34._1_10_ = SUB1510(auVar44 << 0x30,5);
  auVar34[0] = auVar126[2];
  auVar45._11_4_ = 0;
  auVar45._0_11_ = auVar34;
  auVar26[2] = auVar126[1];
  auVar26._0_2_ = auVar126._0_2_;
  auVar26._3_12_ = SUB1512(auVar45 << 0x20,3);
  uVar74 = auVar126._0_2_ & 0xff;
  uVar64 = (ushort)auVar126[8];
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar100._0_13_;
  auVar2[0xe] = auVar100[7];
  auVar6[0xc] = auVar100[6];
  auVar6._0_12_ = auVar100._0_12_;
  auVar6._13_2_ = auVar2._13_2_;
  auVar10[0xb] = 0;
  auVar10._0_11_ = auVar100._0_11_;
  auVar10._12_3_ = auVar6._12_3_;
  auVar14[10] = auVar100[5];
  auVar14._0_10_ = auVar100._0_10_;
  auVar14._11_4_ = auVar10._11_4_;
  auVar18[9] = 0;
  auVar18._0_9_ = auVar100._0_9_;
  auVar18._10_5_ = auVar14._10_5_;
  auVar22[8] = auVar100[4];
  auVar22._0_8_ = auVar100._0_8_;
  auVar22._9_6_ = auVar18._9_6_;
  auVar35._7_8_ = 0;
  auVar35._0_7_ = auVar22._8_7_;
  Var36 = CONCAT81(SUB158(auVar35 << 0x40,7),auVar100[3]);
  auVar46._9_6_ = 0;
  auVar46._0_9_ = Var36;
  auVar37._1_10_ = SUB1510(auVar46 << 0x30,5);
  auVar37[0] = auVar100[2];
  auVar47._11_4_ = 0;
  auVar47._0_11_ = auVar37;
  auVar38._1_12_ = SUB1512(auVar47 << 0x20,3);
  auVar38[0] = auVar100[1];
  uVar81 = (ushort)auVar100[0];
  uVar65 = (ushort)auVar100[8];
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar127._0_13_;
  auVar3[0xe] = auVar127[7];
  auVar7[0xc] = auVar127[6];
  auVar7._0_12_ = auVar127._0_12_;
  auVar7._13_2_ = auVar3._13_2_;
  auVar11[0xb] = 0;
  auVar11._0_11_ = auVar127._0_11_;
  auVar11._12_3_ = auVar7._12_3_;
  auVar15[10] = auVar127[5];
  auVar15._0_10_ = auVar127._0_10_;
  auVar15._11_4_ = auVar11._11_4_;
  auVar19[9] = 0;
  auVar19._0_9_ = auVar127._0_9_;
  auVar19._10_5_ = auVar15._10_5_;
  auVar23[8] = auVar127[4];
  auVar23._0_8_ = auVar127._0_8_;
  auVar23._9_6_ = auVar19._9_6_;
  auVar39._7_8_ = 0;
  auVar39._0_7_ = auVar23._8_7_;
  Var40 = CONCAT81(SUB158(auVar39 << 0x40,7),auVar127[3]);
  auVar48._9_6_ = 0;
  auVar48._0_9_ = Var40;
  auVar41._1_10_ = SUB1510(auVar48 << 0x30,5);
  auVar41[0] = auVar127[2];
  auVar49._11_4_ = 0;
  auVar49._0_11_ = auVar41;
  auVar27[2] = auVar127[1];
  auVar27._0_2_ = auVar127._0_2_;
  auVar27._3_12_ = SUB1512(auVar49 << 0x20,3);
  uVar88 = auVar127._0_2_ & 0xff;
  uVar66 = (ushort)auVar127[8];
  sVar52 = auVar53._0_2_;
  sVar55 = auVar53._2_2_;
  auVar95._2_2_ = sVar55 * 0x10;
  auVar95._0_2_ = sVar52;
  auVar95._4_2_ = sVar52 * 0x1f;
  auVar95._6_2_ = sVar55 * 0x2e;
  auVar95._8_2_ = sVar52 * 0x3c;
  auVar95._10_2_ = sVar55 * 0x4a;
  auVar95._12_2_ = sVar52 * 0x57;
  auVar95._14_2_ = sVar55 * 99;
  auVar53._0_2_ = sVar52 * 0xbe;
  auVar53._2_2_ = sVar55 * 0xc5;
  auVar53._4_2_ = sVar52 * 0xcc;
  auVar53._6_2_ = sVar55 * 0xd3;
  auVar53._8_2_ = sVar52 * 0xd9;
  auVar53._10_2_ = sVar55 * 0xde;
  auVar53._12_2_ = sVar52 * 0xe3;
  auVar53._14_2_ = sVar55 * 0xe7;
  puVar51 = dst + 0x30;
  uVar50 = 0xfefdfefe;
  do {
    uVar50 = uVar50 + 0x2020202;
    auVar125._4_4_ = uVar50;
    auVar125._0_4_ = uVar50;
    auVar125._8_4_ = uVar50;
    auVar125._12_4_ = uVar50;
    auVar96 = pshufb(auVar54,auVar125);
    auVar125 = pshufb(auVar95,auVar125);
    sVar124 = auVar96._0_2_;
    sVar68 = auVar31._0_2_;
    sVar129 = auVar96._2_2_;
    sVar69 = auVar30._0_2_;
    sVar131 = auVar96._4_2_;
    sVar70 = (short)Var29;
    sVar133 = auVar96._6_2_;
    sVar71 = auVar24._8_2_;
    sVar135 = auVar96._8_2_;
    sVar72 = auVar16._10_2_;
    sVar137 = auVar96._10_2_;
    sVar73 = auVar8._12_2_;
    sVar139 = auVar96._12_2_;
    sVar141 = auVar96._14_2_;
    uVar25 = auVar4._13_2_ >> 8;
    uVar57 = (ushort)auVar97[9];
    uVar58 = (ushort)auVar97[10];
    uVar59 = (ushort)auVar97[0xb];
    uVar60 = (ushort)auVar97[0xc];
    uVar61 = (ushort)auVar97[0xd];
    uVar62 = (ushort)auVar97[0xe];
    uVar63 = (ushort)auVar97[0xf];
    sVar123 = auVar125._0_2_ + 0x80;
    sVar128 = auVar125._2_2_ + 0x80;
    sVar130 = auVar125._4_2_ + 0x80;
    sVar132 = auVar125._6_2_ + 0x80;
    sVar134 = auVar125._8_2_ + 0x80;
    sVar136 = auVar125._10_2_ + 0x80;
    sVar138 = auVar125._12_2_ + 0x80;
    sVar140 = auVar125._14_2_ + 0x80;
    uVar142 = sVar124 * uVar67 + sVar123;
    uVar144 = sVar129 * sVar68 + sVar128;
    uVar146 = sVar131 * sVar69 + sVar130;
    uVar148 = sVar133 * sVar70 + sVar132;
    uVar150 = sVar135 * sVar71 + sVar134;
    uVar156 = sVar137 * sVar72 + sVar136;
    uVar162 = sVar139 * sVar73 + sVar138;
    uVar168 = sVar141 * uVar25 + sVar140;
    uVar143 = uVar142 >> 8;
    uVar145 = uVar144 >> 8;
    uVar147 = uVar146 >> 8;
    uVar149 = uVar148 >> 8;
    uVar151 = uVar150 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar98 = sVar124 * uVar56 + sVar123;
    uVar101 = sVar129 * uVar57 + sVar128;
    uVar103 = sVar131 * uVar58 + sVar130;
    uVar105 = sVar133 * uVar59 + sVar132;
    uVar107 = sVar135 * uVar60 + sVar134;
    uVar111 = sVar137 * uVar61 + sVar136;
    uVar115 = sVar139 * uVar62 + sVar138;
    uVar119 = sVar141 * uVar63 + sVar140;
    uVar99 = uVar98 >> 8;
    uVar102 = uVar101 >> 8;
    uVar104 = uVar103 >> 8;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar112 = uVar111 >> 8;
    uVar116 = uVar115 >> 8;
    uVar120 = uVar119 >> 8;
    puVar51[-0x30] = (uVar143 != 0) * (uVar143 < 0x100) * (char)(uVar142 >> 8) - (0xff < uVar143);
    puVar51[-0x2f] = (uVar145 != 0) * (uVar145 < 0x100) * (char)(uVar144 >> 8) - (0xff < uVar145);
    puVar51[-0x2e] = (uVar147 != 0) * (uVar147 < 0x100) * (char)(uVar146 >> 8) - (0xff < uVar147);
    puVar51[-0x2d] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar51[-0x2c] = (uVar151 != 0) * (uVar151 < 0x100) * (char)(uVar150 >> 8) - (0xff < uVar151);
    puVar51[-0x2b] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar51[-0x2a] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar51[-0x29] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar51[-0x28] = (uVar99 != 0) * (uVar99 < 0x100) * (char)(uVar98 >> 8) - (0xff < uVar99);
    puVar51[-0x27] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
    puVar51[-0x26] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar51[-0x25] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar51[-0x24] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar51[-0x23] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar51[-0x22] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar51[-0x21] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    sVar75 = auVar26._2_2_;
    sVar76 = auVar34._0_2_;
    sVar77 = (short)Var33;
    sVar78 = auVar21._8_2_;
    sVar79 = auVar13._10_2_;
    sVar80 = auVar5._12_2_;
    uVar98 = auVar1._13_2_ >> 8;
    uVar102 = (ushort)auVar126[9];
    uVar103 = (ushort)auVar126[10];
    uVar104 = (ushort)auVar126[0xb];
    uVar105 = (ushort)auVar126[0xc];
    uVar106 = (ushort)auVar126[0xd];
    uVar107 = (ushort)auVar126[0xe];
    uVar108 = (ushort)auVar126[0xf];
    uVar99 = sVar124 * uVar74 + sVar123;
    uVar111 = sVar129 * sVar75 + sVar128;
    uVar115 = sVar131 * sVar76 + sVar130;
    uVar119 = sVar133 * sVar77 + sVar132;
    uVar142 = sVar135 * sVar78 + sVar134;
    uVar144 = sVar137 * sVar79 + sVar136;
    uVar146 = sVar139 * sVar80 + sVar138;
    uVar148 = sVar141 * uVar98 + sVar140;
    uVar101 = uVar99 >> 8;
    uVar112 = uVar111 >> 8;
    uVar116 = uVar115 >> 8;
    uVar120 = uVar119 >> 8;
    uVar143 = uVar142 >> 8;
    uVar145 = uVar144 >> 8;
    uVar147 = uVar146 >> 8;
    uVar149 = uVar148 >> 8;
    uVar150 = sVar124 * uVar64 + sVar123;
    uVar156 = sVar129 * uVar102 + sVar128;
    uVar162 = sVar131 * uVar103 + sVar130;
    uVar168 = sVar133 * uVar104 + sVar132;
    uVar152 = sVar135 * uVar105 + sVar134;
    uVar158 = sVar137 * uVar106 + sVar136;
    uVar164 = sVar139 * uVar107 + sVar138;
    uVar170 = sVar141 * uVar108 + sVar140;
    uVar151 = uVar150 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    puVar51[-0x20] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar101);
    puVar51[-0x1f] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar51[-0x1e] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar51[-0x1d] = (uVar120 != 0) * (uVar120 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar120);
    puVar51[-0x1c] = (uVar143 != 0) * (uVar143 < 0x100) * (char)(uVar142 >> 8) - (0xff < uVar143);
    puVar51[-0x1b] = (uVar145 != 0) * (uVar145 < 0x100) * (char)(uVar144 >> 8) - (0xff < uVar145);
    puVar51[-0x1a] = (uVar147 != 0) * (uVar147 < 0x100) * (char)(uVar146 >> 8) - (0xff < uVar147);
    puVar51[-0x19] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar51[-0x18] = (uVar151 != 0) * (uVar151 < 0x100) * (char)(uVar150 >> 8) - (0xff < uVar151);
    puVar51[-0x17] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar51[-0x16] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar51[-0x15] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar51[-0x14] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar51[-0x13] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar51[-0x12] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar51[-0x11] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    sVar82 = auVar38._0_2_;
    sVar83 = auVar37._0_2_;
    sVar84 = (short)Var36;
    sVar85 = auVar22._8_2_;
    sVar86 = auVar14._10_2_;
    sVar87 = auVar6._12_2_;
    uVar99 = auVar2._13_2_ >> 8;
    uVar111 = (ushort)auVar100[9];
    uVar112 = (ushort)auVar100[10];
    uVar115 = (ushort)auVar100[0xb];
    uVar116 = (ushort)auVar100[0xc];
    uVar119 = (ushort)auVar100[0xd];
    uVar120 = (ushort)auVar100[0xe];
    uVar142 = (ushort)auVar100[0xf];
    uVar101 = sVar124 * uVar81 + sVar123;
    uVar144 = sVar129 * sVar82 + sVar128;
    uVar146 = sVar131 * sVar83 + sVar130;
    uVar148 = sVar133 * sVar84 + sVar132;
    uVar150 = sVar135 * sVar85 + sVar134;
    uVar156 = sVar137 * sVar86 + sVar136;
    uVar162 = sVar139 * sVar87 + sVar138;
    uVar168 = sVar141 * uVar99 + sVar140;
    uVar143 = uVar101 >> 8;
    uVar145 = uVar144 >> 8;
    uVar147 = uVar146 >> 8;
    uVar149 = uVar148 >> 8;
    uVar151 = uVar150 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar152 = sVar124 * uVar65 + sVar123;
    uVar158 = sVar129 * uVar111 + sVar128;
    uVar164 = sVar131 * uVar112 + sVar130;
    uVar170 = sVar133 * uVar115 + sVar132;
    uVar154 = sVar135 * uVar116 + sVar134;
    uVar160 = sVar137 * uVar119 + sVar136;
    uVar166 = sVar139 * uVar120 + sVar138;
    uVar172 = sVar141 * uVar142 + sVar140;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar155 = uVar154 >> 8;
    uVar161 = uVar160 >> 8;
    uVar167 = uVar166 >> 8;
    uVar173 = uVar172 >> 8;
    puVar51[-0x10] = (uVar143 != 0) * (uVar143 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar143);
    puVar51[-0xf] = (uVar145 != 0) * (uVar145 < 0x100) * (char)(uVar144 >> 8) - (0xff < uVar145);
    puVar51[-0xe] = (uVar147 != 0) * (uVar147 < 0x100) * (char)(uVar146 >> 8) - (0xff < uVar147);
    puVar51[-0xd] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar51[-0xc] = (uVar151 != 0) * (uVar151 < 0x100) * (char)(uVar150 >> 8) - (0xff < uVar151);
    puVar51[-0xb] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar51[-10] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar51[-9] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar51[-8] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar51[-7] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar51[-6] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar51[-5] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar51[-4] = (uVar155 != 0) * (uVar155 < 0x100) * (char)(uVar154 >> 8) - (0xff < uVar155);
    puVar51[-3] = (uVar161 != 0) * (uVar161 < 0x100) * (char)(uVar160 >> 8) - (0xff < uVar161);
    puVar51[-2] = (uVar167 != 0) * (uVar167 < 0x100) * (char)(uVar166 >> 8) - (0xff < uVar167);
    puVar51[-1] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    sVar89 = auVar27._2_2_;
    sVar90 = auVar41._0_2_;
    sVar91 = (short)Var40;
    sVar92 = auVar23._8_2_;
    sVar93 = auVar15._10_2_;
    sVar94 = auVar7._12_2_;
    uVar101 = auVar3._13_2_ >> 8;
    uVar143 = (ushort)auVar127[9];
    uVar144 = (ushort)auVar127[10];
    uVar145 = (ushort)auVar127[0xb];
    uVar146 = (ushort)auVar127[0xc];
    uVar147 = (ushort)auVar127[0xd];
    uVar148 = (ushort)auVar127[0xe];
    uVar149 = (ushort)auVar127[0xf];
    uVar154 = sVar124 * uVar88 + sVar123;
    uVar160 = sVar129 * sVar89 + sVar128;
    uVar166 = sVar131 * sVar90 + sVar130;
    uVar172 = sVar133 * sVar91 + sVar132;
    uVar109 = sVar135 * sVar92 + sVar134;
    uVar113 = sVar137 * sVar93 + sVar136;
    uVar117 = sVar139 * sVar94 + sVar138;
    uVar121 = sVar141 * uVar101 + sVar140;
    uVar155 = uVar154 >> 8;
    uVar161 = uVar160 >> 8;
    uVar167 = uVar166 >> 8;
    uVar173 = uVar172 >> 8;
    uVar110 = uVar109 >> 8;
    uVar114 = uVar113 >> 8;
    uVar118 = uVar117 >> 8;
    uVar122 = uVar121 >> 8;
    uVar150 = sVar124 * uVar66 + sVar123;
    uVar156 = sVar129 * uVar143 + sVar128;
    uVar162 = sVar131 * uVar144 + sVar130;
    uVar168 = sVar133 * uVar145 + sVar132;
    uVar152 = sVar135 * uVar146 + sVar134;
    uVar158 = sVar137 * uVar147 + sVar136;
    uVar164 = sVar139 * uVar148 + sVar138;
    uVar170 = sVar141 * uVar149 + sVar140;
    uVar151 = uVar150 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    *puVar51 = (uVar155 != 0) * (uVar155 < 0x100) * (char)(uVar154 >> 8) - (0xff < uVar155);
    puVar51[1] = (uVar161 != 0) * (uVar161 < 0x100) * (char)(uVar160 >> 8) - (0xff < uVar161);
    puVar51[2] = (uVar167 != 0) * (uVar167 < 0x100) * (char)(uVar166 >> 8) - (0xff < uVar167);
    puVar51[3] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    puVar51[4] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar51[5] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar51[6] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar51[7] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar51[8] = (uVar151 != 0) * (uVar151 < 0x100) * (char)(uVar150 >> 8) - (0xff < uVar151);
    puVar51[9] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar51[10] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar51[0xb] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar51[0xc] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar51[0xd] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar51[0xe] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar51[0xf] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    auVar96 = _DAT_0050f600;
    puVar51 = puVar51 + stride;
  } while (uVar50 < 0xd0c0d0d);
  auVar97._0_2_ = sVar52 * 0x6f;
  auVar97._2_2_ = sVar55 * 0x7b;
  auVar97._4_2_ = sVar52 * 0x86;
  auVar97._6_2_ = sVar55 * 0x91;
  auVar97._8_2_ = sVar52 * 0x9b;
  auVar97._10_2_ = sVar55 * 0xa4;
  auVar97._12_2_ = sVar52 * 0xad;
  auVar97._14_2_ = sVar55 * 0xb6;
  uVar50 = 0xfefdfefe;
  do {
    uVar50 = uVar50 + 0x2020202;
    auVar126._4_4_ = uVar50;
    auVar126._0_4_ = uVar50;
    auVar126._8_4_ = uVar50;
    auVar126._12_4_ = uVar50;
    auVar100 = pshufb(auVar96,auVar126);
    auVar126 = pshufb(auVar97,auVar126);
    sVar123 = auVar100._0_2_;
    sVar128 = auVar100._2_2_;
    sVar130 = auVar100._4_2_;
    sVar132 = auVar100._6_2_;
    sVar134 = auVar100._8_2_;
    sVar136 = auVar100._10_2_;
    sVar138 = auVar100._12_2_;
    sVar140 = auVar100._14_2_;
    sVar124 = auVar126._0_2_ + 0x80;
    sVar129 = auVar126._2_2_ + 0x80;
    sVar131 = auVar126._4_2_ + 0x80;
    sVar133 = auVar126._6_2_ + 0x80;
    sVar135 = auVar126._8_2_ + 0x80;
    sVar137 = auVar126._10_2_ + 0x80;
    sVar139 = auVar126._12_2_ + 0x80;
    sVar141 = auVar126._14_2_ + 0x80;
    uVar150 = sVar123 * uVar67 + sVar124;
    uVar156 = sVar128 * sVar68 + sVar129;
    uVar162 = sVar130 * sVar69 + sVar131;
    uVar168 = sVar132 * sVar70 + sVar133;
    uVar152 = sVar134 * sVar71 + sVar135;
    uVar158 = sVar136 * sVar72 + sVar137;
    uVar164 = sVar138 * sVar73 + sVar139;
    uVar170 = sVar140 * uVar25 + sVar141;
    uVar151 = uVar150 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar154 = sVar123 * uVar56 + sVar124;
    uVar160 = sVar128 * uVar57 + sVar129;
    uVar166 = sVar130 * uVar58 + sVar131;
    uVar172 = sVar132 * uVar59 + sVar133;
    uVar109 = sVar134 * uVar60 + sVar135;
    uVar113 = sVar136 * uVar61 + sVar137;
    uVar117 = sVar138 * uVar62 + sVar139;
    uVar121 = sVar140 * uVar63 + sVar141;
    uVar155 = uVar154 >> 8;
    uVar161 = uVar160 >> 8;
    uVar167 = uVar166 >> 8;
    uVar173 = uVar172 >> 8;
    uVar110 = uVar109 >> 8;
    uVar114 = uVar113 >> 8;
    uVar118 = uVar117 >> 8;
    uVar122 = uVar121 >> 8;
    puVar51[-0x30] = (uVar151 != 0) * (uVar151 < 0x100) * (char)(uVar150 >> 8) - (0xff < uVar151);
    puVar51[-0x2f] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar51[-0x2e] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar51[-0x2d] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar51[-0x2c] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar51[-0x2b] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar51[-0x2a] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar51[-0x29] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar51[-0x28] = (uVar155 != 0) * (uVar155 < 0x100) * (char)(uVar154 >> 8) - (0xff < uVar155);
    puVar51[-0x27] = (uVar161 != 0) * (uVar161 < 0x100) * (char)(uVar160 >> 8) - (0xff < uVar161);
    puVar51[-0x26] = (uVar167 != 0) * (uVar167 < 0x100) * (char)(uVar166 >> 8) - (0xff < uVar167);
    puVar51[-0x25] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    puVar51[-0x24] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar51[-0x23] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar51[-0x22] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar51[-0x21] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    uVar150 = sVar123 * uVar74 + sVar124;
    uVar156 = sVar128 * sVar75 + sVar129;
    uVar162 = sVar130 * sVar76 + sVar131;
    uVar168 = sVar132 * sVar77 + sVar133;
    uVar152 = sVar134 * sVar78 + sVar135;
    uVar158 = sVar136 * sVar79 + sVar137;
    uVar164 = sVar138 * sVar80 + sVar139;
    uVar170 = sVar140 * uVar98 + sVar141;
    uVar151 = uVar150 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar154 = sVar123 * uVar64 + sVar124;
    uVar160 = sVar128 * uVar102 + sVar129;
    uVar166 = sVar130 * uVar103 + sVar131;
    uVar172 = sVar132 * uVar104 + sVar133;
    uVar109 = sVar134 * uVar105 + sVar135;
    uVar113 = sVar136 * uVar106 + sVar137;
    uVar117 = sVar138 * uVar107 + sVar139;
    uVar121 = sVar140 * uVar108 + sVar141;
    uVar155 = uVar154 >> 8;
    uVar161 = uVar160 >> 8;
    uVar167 = uVar166 >> 8;
    uVar173 = uVar172 >> 8;
    uVar110 = uVar109 >> 8;
    uVar114 = uVar113 >> 8;
    uVar118 = uVar117 >> 8;
    uVar122 = uVar121 >> 8;
    puVar51[-0x20] = (uVar151 != 0) * (uVar151 < 0x100) * (char)(uVar150 >> 8) - (0xff < uVar151);
    puVar51[-0x1f] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar51[-0x1e] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar51[-0x1d] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar51[-0x1c] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar51[-0x1b] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar51[-0x1a] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar51[-0x19] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar51[-0x18] = (uVar155 != 0) * (uVar155 < 0x100) * (char)(uVar154 >> 8) - (0xff < uVar155);
    puVar51[-0x17] = (uVar161 != 0) * (uVar161 < 0x100) * (char)(uVar160 >> 8) - (0xff < uVar161);
    puVar51[-0x16] = (uVar167 != 0) * (uVar167 < 0x100) * (char)(uVar166 >> 8) - (0xff < uVar167);
    puVar51[-0x15] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    puVar51[-0x14] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar51[-0x13] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar51[-0x12] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar51[-0x11] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    uVar150 = sVar123 * uVar81 + sVar124;
    uVar156 = sVar128 * sVar82 + sVar129;
    uVar162 = sVar130 * sVar83 + sVar131;
    uVar168 = sVar132 * sVar84 + sVar133;
    uVar152 = sVar134 * sVar85 + sVar135;
    uVar158 = sVar136 * sVar86 + sVar137;
    uVar164 = sVar138 * sVar87 + sVar139;
    uVar170 = sVar140 * uVar99 + sVar141;
    uVar151 = uVar150 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar154 = sVar123 * uVar65 + sVar124;
    uVar160 = sVar128 * uVar111 + sVar129;
    uVar166 = sVar130 * uVar112 + sVar131;
    uVar172 = sVar132 * uVar115 + sVar133;
    uVar109 = sVar134 * uVar116 + sVar135;
    uVar113 = sVar136 * uVar119 + sVar137;
    uVar117 = sVar138 * uVar120 + sVar139;
    uVar121 = sVar140 * uVar142 + sVar141;
    uVar155 = uVar154 >> 8;
    uVar161 = uVar160 >> 8;
    uVar167 = uVar166 >> 8;
    uVar173 = uVar172 >> 8;
    uVar110 = uVar109 >> 8;
    uVar114 = uVar113 >> 8;
    uVar118 = uVar117 >> 8;
    uVar122 = uVar121 >> 8;
    puVar51[-0x10] = (uVar151 != 0) * (uVar151 < 0x100) * (char)(uVar150 >> 8) - (0xff < uVar151);
    puVar51[-0xf] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar51[-0xe] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar51[-0xd] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar51[-0xc] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar51[-0xb] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar51[-10] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar51[-9] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar51[-8] = (uVar155 != 0) * (uVar155 < 0x100) * (char)(uVar154 >> 8) - (0xff < uVar155);
    puVar51[-7] = (uVar161 != 0) * (uVar161 < 0x100) * (char)(uVar160 >> 8) - (0xff < uVar161);
    puVar51[-6] = (uVar167 != 0) * (uVar167 < 0x100) * (char)(uVar166 >> 8) - (0xff < uVar167);
    puVar51[-5] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    puVar51[-4] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar51[-3] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar51[-2] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar51[-1] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    uVar150 = sVar123 * uVar88 + sVar124;
    uVar156 = sVar128 * sVar89 + sVar129;
    uVar162 = sVar130 * sVar90 + sVar131;
    uVar168 = sVar132 * sVar91 + sVar133;
    uVar152 = sVar134 * sVar92 + sVar135;
    uVar158 = sVar136 * sVar93 + sVar137;
    uVar164 = sVar138 * sVar94 + sVar139;
    uVar170 = sVar140 * uVar101 + sVar141;
    uVar151 = uVar150 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar154 = sVar123 * uVar66 + sVar124;
    uVar160 = sVar128 * uVar143 + sVar129;
    uVar166 = sVar130 * uVar144 + sVar131;
    uVar172 = sVar132 * uVar145 + sVar133;
    uVar109 = sVar134 * uVar146 + sVar135;
    uVar113 = sVar136 * uVar147 + sVar137;
    uVar117 = sVar138 * uVar148 + sVar139;
    uVar121 = sVar140 * uVar149 + sVar141;
    uVar155 = uVar154 >> 8;
    uVar161 = uVar160 >> 8;
    uVar167 = uVar166 >> 8;
    uVar173 = uVar172 >> 8;
    uVar110 = uVar109 >> 8;
    uVar114 = uVar113 >> 8;
    uVar118 = uVar117 >> 8;
    uVar122 = uVar121 >> 8;
    *puVar51 = (uVar151 != 0) * (uVar151 < 0x100) * (char)(uVar150 >> 8) - (0xff < uVar151);
    puVar51[1] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar51[2] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar51[3] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar51[4] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar51[5] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar51[6] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar51[7] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar51[8] = (uVar155 != 0) * (uVar155 < 0x100) * (char)(uVar154 >> 8) - (0xff < uVar155);
    puVar51[9] = (uVar161 != 0) * (uVar161 < 0x100) * (char)(uVar160 >> 8) - (0xff < uVar161);
    puVar51[10] = (uVar167 != 0) * (uVar167 < 0x100) * (char)(uVar166 >> 8) - (0xff < uVar167);
    puVar51[0xb] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    puVar51[0xc] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar51[0xd] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar51[0xe] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar51[0xf] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    auVar126 = _DAT_0050f620;
    puVar51 = puVar51 + stride;
  } while (uVar50 < 0xd0c0d0d);
  uVar50 = 0xfefdfefe;
  do {
    uVar50 = uVar50 + 0x2020202;
    auVar100._4_4_ = uVar50;
    auVar100._0_4_ = uVar50;
    auVar100._8_4_ = uVar50;
    auVar100._12_4_ = uVar50;
    auVar97 = pshufb(auVar126,auVar100);
    auVar100 = pshufb(auVar53,auVar100);
    sVar123 = auVar97._0_2_;
    sVar128 = auVar97._2_2_;
    sVar130 = auVar97._4_2_;
    sVar132 = auVar97._6_2_;
    sVar134 = auVar97._8_2_;
    sVar136 = auVar97._10_2_;
    sVar138 = auVar97._12_2_;
    sVar140 = auVar97._14_2_;
    sVar124 = auVar100._0_2_ + 0x80;
    sVar129 = auVar100._2_2_ + 0x80;
    sVar131 = auVar100._4_2_ + 0x80;
    sVar133 = auVar100._6_2_ + 0x80;
    sVar135 = auVar100._8_2_ + 0x80;
    sVar137 = auVar100._10_2_ + 0x80;
    sVar139 = auVar100._12_2_ + 0x80;
    sVar141 = auVar100._14_2_ + 0x80;
    uVar150 = sVar123 * uVar67 + sVar124;
    uVar156 = sVar128 * sVar68 + sVar129;
    uVar162 = sVar130 * sVar69 + sVar131;
    uVar168 = sVar132 * sVar70 + sVar133;
    uVar152 = sVar134 * sVar71 + sVar135;
    uVar158 = sVar136 * sVar72 + sVar137;
    uVar164 = sVar138 * sVar73 + sVar139;
    uVar170 = sVar140 * uVar25 + sVar141;
    uVar151 = uVar150 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar154 = sVar123 * uVar56 + sVar124;
    uVar160 = sVar128 * uVar57 + sVar129;
    uVar166 = sVar130 * uVar58 + sVar131;
    uVar172 = sVar132 * uVar59 + sVar133;
    uVar109 = sVar134 * uVar60 + sVar135;
    uVar113 = sVar136 * uVar61 + sVar137;
    uVar117 = sVar138 * uVar62 + sVar139;
    uVar121 = sVar140 * uVar63 + sVar141;
    uVar155 = uVar154 >> 8;
    uVar161 = uVar160 >> 8;
    uVar167 = uVar166 >> 8;
    uVar173 = uVar172 >> 8;
    uVar110 = uVar109 >> 8;
    uVar114 = uVar113 >> 8;
    uVar118 = uVar117 >> 8;
    uVar122 = uVar121 >> 8;
    puVar51[-0x30] = (uVar151 != 0) * (uVar151 < 0x100) * (char)(uVar150 >> 8) - (0xff < uVar151);
    puVar51[-0x2f] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar51[-0x2e] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar51[-0x2d] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar51[-0x2c] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar51[-0x2b] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar51[-0x2a] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar51[-0x29] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar51[-0x28] = (uVar155 != 0) * (uVar155 < 0x100) * (char)(uVar154 >> 8) - (0xff < uVar155);
    puVar51[-0x27] = (uVar161 != 0) * (uVar161 < 0x100) * (char)(uVar160 >> 8) - (0xff < uVar161);
    puVar51[-0x26] = (uVar167 != 0) * (uVar167 < 0x100) * (char)(uVar166 >> 8) - (0xff < uVar167);
    puVar51[-0x25] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    puVar51[-0x24] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar51[-0x23] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar51[-0x22] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar51[-0x21] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    uVar150 = sVar123 * uVar74 + sVar124;
    uVar156 = sVar128 * sVar75 + sVar129;
    uVar162 = sVar130 * sVar76 + sVar131;
    uVar168 = sVar132 * sVar77 + sVar133;
    uVar152 = sVar134 * sVar78 + sVar135;
    uVar158 = sVar136 * sVar79 + sVar137;
    uVar164 = sVar138 * sVar80 + sVar139;
    uVar170 = sVar140 * uVar98 + sVar141;
    uVar151 = uVar150 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar154 = sVar123 * uVar64 + sVar124;
    uVar160 = sVar128 * uVar102 + sVar129;
    uVar166 = sVar130 * uVar103 + sVar131;
    uVar172 = sVar132 * uVar104 + sVar133;
    uVar109 = sVar134 * uVar105 + sVar135;
    uVar113 = sVar136 * uVar106 + sVar137;
    uVar117 = sVar138 * uVar107 + sVar139;
    uVar121 = sVar140 * uVar108 + sVar141;
    uVar155 = uVar154 >> 8;
    uVar161 = uVar160 >> 8;
    uVar167 = uVar166 >> 8;
    uVar173 = uVar172 >> 8;
    uVar110 = uVar109 >> 8;
    uVar114 = uVar113 >> 8;
    uVar118 = uVar117 >> 8;
    uVar122 = uVar121 >> 8;
    puVar51[-0x20] = (uVar151 != 0) * (uVar151 < 0x100) * (char)(uVar150 >> 8) - (0xff < uVar151);
    puVar51[-0x1f] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar51[-0x1e] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar51[-0x1d] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar51[-0x1c] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar51[-0x1b] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar51[-0x1a] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar51[-0x19] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar51[-0x18] = (uVar155 != 0) * (uVar155 < 0x100) * (char)(uVar154 >> 8) - (0xff < uVar155);
    puVar51[-0x17] = (uVar161 != 0) * (uVar161 < 0x100) * (char)(uVar160 >> 8) - (0xff < uVar161);
    puVar51[-0x16] = (uVar167 != 0) * (uVar167 < 0x100) * (char)(uVar166 >> 8) - (0xff < uVar167);
    puVar51[-0x15] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    puVar51[-0x14] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar51[-0x13] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar51[-0x12] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar51[-0x11] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    uVar150 = sVar123 * uVar81 + sVar124;
    uVar156 = sVar128 * sVar82 + sVar129;
    uVar162 = sVar130 * sVar83 + sVar131;
    uVar168 = sVar132 * sVar84 + sVar133;
    uVar152 = sVar134 * sVar85 + sVar135;
    uVar158 = sVar136 * sVar86 + sVar137;
    uVar164 = sVar138 * sVar87 + sVar139;
    uVar170 = sVar140 * uVar99 + sVar141;
    uVar151 = uVar150 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar154 = sVar123 * uVar65 + sVar124;
    uVar160 = sVar128 * uVar111 + sVar129;
    uVar166 = sVar130 * uVar112 + sVar131;
    uVar172 = sVar132 * uVar115 + sVar133;
    uVar109 = sVar134 * uVar116 + sVar135;
    uVar113 = sVar136 * uVar119 + sVar137;
    uVar117 = sVar138 * uVar120 + sVar139;
    uVar121 = sVar140 * uVar142 + sVar141;
    uVar155 = uVar154 >> 8;
    uVar161 = uVar160 >> 8;
    uVar167 = uVar166 >> 8;
    uVar173 = uVar172 >> 8;
    uVar110 = uVar109 >> 8;
    uVar114 = uVar113 >> 8;
    uVar118 = uVar117 >> 8;
    uVar122 = uVar121 >> 8;
    puVar51[-0x10] = (uVar151 != 0) * (uVar151 < 0x100) * (char)(uVar150 >> 8) - (0xff < uVar151);
    puVar51[-0xf] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar51[-0xe] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar51[-0xd] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar51[-0xc] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar51[-0xb] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar51[-10] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar51[-9] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar51[-8] = (uVar155 != 0) * (uVar155 < 0x100) * (char)(uVar154 >> 8) - (0xff < uVar155);
    puVar51[-7] = (uVar161 != 0) * (uVar161 < 0x100) * (char)(uVar160 >> 8) - (0xff < uVar161);
    puVar51[-6] = (uVar167 != 0) * (uVar167 < 0x100) * (char)(uVar166 >> 8) - (0xff < uVar167);
    puVar51[-5] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    puVar51[-4] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar51[-3] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar51[-2] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar51[-1] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    uVar150 = sVar123 * uVar88 + sVar124;
    uVar156 = sVar128 * sVar89 + sVar129;
    uVar162 = sVar130 * sVar90 + sVar131;
    uVar168 = sVar132 * sVar91 + sVar133;
    uVar152 = sVar134 * sVar92 + sVar135;
    uVar158 = sVar136 * sVar93 + sVar137;
    uVar164 = sVar138 * sVar94 + sVar139;
    uVar170 = sVar140 * uVar101 + sVar141;
    uVar151 = uVar150 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar154 = sVar123 * uVar66 + sVar124;
    uVar160 = sVar128 * uVar143 + sVar129;
    uVar166 = sVar130 * uVar144 + sVar131;
    uVar172 = sVar132 * uVar145 + sVar133;
    uVar109 = sVar134 * uVar146 + sVar135;
    uVar113 = sVar136 * uVar147 + sVar137;
    uVar117 = sVar138 * uVar148 + sVar139;
    uVar121 = sVar140 * uVar149 + sVar141;
    uVar155 = uVar154 >> 8;
    uVar161 = uVar160 >> 8;
    uVar167 = uVar166 >> 8;
    uVar173 = uVar172 >> 8;
    uVar110 = uVar109 >> 8;
    uVar114 = uVar113 >> 8;
    uVar118 = uVar117 >> 8;
    uVar122 = uVar121 >> 8;
    *puVar51 = (uVar151 != 0) * (uVar151 < 0x100) * (char)(uVar150 >> 8) - (0xff < uVar151);
    puVar51[1] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar51[2] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar51[3] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar51[4] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar51[5] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar51[6] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar51[7] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar51[8] = (uVar155 != 0) * (uVar155 < 0x100) * (char)(uVar154 >> 8) - (0xff < uVar155);
    puVar51[9] = (uVar161 != 0) * (uVar161 < 0x100) * (char)(uVar160 >> 8) - (0xff < uVar161);
    puVar51[10] = (uVar167 != 0) * (uVar167 < 0x100) * (char)(uVar166 >> 8) - (0xff < uVar167);
    puVar51[0xb] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    puVar51[0xc] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar51[0xd] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar51[0xe] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar51[0xf] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    auVar97 = _DAT_0050f640;
    puVar51 = puVar51 + stride;
  } while (uVar50 < 0xd0c0d0d);
  auVar127._0_2_ = sVar52 * 0xeb;
  auVar127._2_2_ = sVar55 * 0xef;
  auVar127._4_2_ = sVar52 * 0xf2;
  auVar127._6_2_ = sVar55 * 0xf4;
  auVar127._8_2_ = sVar52 * 0xf6;
  auVar127._10_2_ = sVar55 * 0xf7;
  auVar127._12_2_ = sVar52 * 0xf8;
  auVar127._14_2_ = sVar55 * 0xf8;
  uVar50 = 0xfefdfefe;
  do {
    uVar50 = uVar50 + 0x2020202;
    auVar54._4_4_ = uVar50;
    auVar54._0_4_ = uVar50;
    auVar54._8_4_ = uVar50;
    auVar54._12_4_ = uVar50;
    auVar126 = pshufb(auVar97,auVar54);
    auVar100 = pshufb(auVar127,auVar54);
    sVar52 = auVar126._0_2_;
    sVar55 = auVar126._2_2_;
    sVar123 = auVar126._4_2_;
    sVar128 = auVar126._6_2_;
    sVar130 = auVar126._8_2_;
    sVar132 = auVar126._10_2_;
    sVar134 = auVar126._12_2_;
    sVar136 = auVar126._14_2_;
    sVar138 = auVar100._0_2_ + 0x80;
    sVar140 = auVar100._2_2_ + 0x80;
    sVar124 = auVar100._4_2_ + 0x80;
    sVar129 = auVar100._6_2_ + 0x80;
    sVar131 = auVar100._8_2_ + 0x80;
    sVar133 = auVar100._10_2_ + 0x80;
    sVar135 = auVar100._12_2_ + 0x80;
    sVar137 = auVar100._14_2_ + 0x80;
    uVar150 = sVar52 * uVar67 + sVar138;
    uVar156 = sVar55 * sVar68 + sVar140;
    uVar162 = sVar123 * sVar69 + sVar124;
    uVar168 = sVar128 * sVar70 + sVar129;
    uVar152 = sVar130 * sVar71 + sVar131;
    uVar158 = sVar132 * sVar72 + sVar133;
    uVar164 = sVar134 * sVar73 + sVar135;
    uVar170 = sVar136 * uVar25 + sVar137;
    uVar151 = uVar150 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar154 = sVar52 * uVar56 + sVar138;
    uVar160 = sVar55 * uVar57 + sVar140;
    uVar166 = sVar123 * uVar58 + sVar124;
    uVar172 = sVar128 * uVar59 + sVar129;
    uVar109 = sVar130 * uVar60 + sVar131;
    uVar113 = sVar132 * uVar61 + sVar133;
    uVar117 = sVar134 * uVar62 + sVar135;
    uVar121 = sVar136 * uVar63 + sVar137;
    uVar155 = uVar154 >> 8;
    uVar161 = uVar160 >> 8;
    uVar167 = uVar166 >> 8;
    uVar173 = uVar172 >> 8;
    uVar110 = uVar109 >> 8;
    uVar114 = uVar113 >> 8;
    uVar118 = uVar117 >> 8;
    uVar122 = uVar121 >> 8;
    puVar51[-0x30] = (uVar151 != 0) * (uVar151 < 0x100) * (char)(uVar150 >> 8) - (0xff < uVar151);
    puVar51[-0x2f] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar51[-0x2e] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar51[-0x2d] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar51[-0x2c] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar51[-0x2b] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar51[-0x2a] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar51[-0x29] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar51[-0x28] = (uVar155 != 0) * (uVar155 < 0x100) * (char)(uVar154 >> 8) - (0xff < uVar155);
    puVar51[-0x27] = (uVar161 != 0) * (uVar161 < 0x100) * (char)(uVar160 >> 8) - (0xff < uVar161);
    puVar51[-0x26] = (uVar167 != 0) * (uVar167 < 0x100) * (char)(uVar166 >> 8) - (0xff < uVar167);
    puVar51[-0x25] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    puVar51[-0x24] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar51[-0x23] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar51[-0x22] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar51[-0x21] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    uVar150 = sVar52 * uVar74 + sVar138;
    uVar156 = sVar55 * sVar75 + sVar140;
    uVar162 = sVar123 * sVar76 + sVar124;
    uVar168 = sVar128 * sVar77 + sVar129;
    uVar152 = sVar130 * sVar78 + sVar131;
    uVar158 = sVar132 * sVar79 + sVar133;
    uVar164 = sVar134 * sVar80 + sVar135;
    uVar170 = sVar136 * uVar98 + sVar137;
    uVar151 = uVar150 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar154 = sVar52 * uVar64 + sVar138;
    uVar160 = sVar55 * uVar102 + sVar140;
    uVar166 = sVar123 * uVar103 + sVar124;
    uVar172 = sVar128 * uVar104 + sVar129;
    uVar109 = sVar130 * uVar105 + sVar131;
    uVar113 = sVar132 * uVar106 + sVar133;
    uVar117 = sVar134 * uVar107 + sVar135;
    uVar121 = sVar136 * uVar108 + sVar137;
    uVar155 = uVar154 >> 8;
    uVar161 = uVar160 >> 8;
    uVar167 = uVar166 >> 8;
    uVar173 = uVar172 >> 8;
    uVar110 = uVar109 >> 8;
    uVar114 = uVar113 >> 8;
    uVar118 = uVar117 >> 8;
    uVar122 = uVar121 >> 8;
    puVar51[-0x20] = (uVar151 != 0) * (uVar151 < 0x100) * (char)(uVar150 >> 8) - (0xff < uVar151);
    puVar51[-0x1f] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar51[-0x1e] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar51[-0x1d] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar51[-0x1c] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar51[-0x1b] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar51[-0x1a] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar51[-0x19] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar51[-0x18] = (uVar155 != 0) * (uVar155 < 0x100) * (char)(uVar154 >> 8) - (0xff < uVar155);
    puVar51[-0x17] = (uVar161 != 0) * (uVar161 < 0x100) * (char)(uVar160 >> 8) - (0xff < uVar161);
    puVar51[-0x16] = (uVar167 != 0) * (uVar167 < 0x100) * (char)(uVar166 >> 8) - (0xff < uVar167);
    puVar51[-0x15] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    puVar51[-0x14] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar51[-0x13] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar51[-0x12] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar51[-0x11] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    uVar150 = sVar52 * uVar81 + sVar138;
    uVar156 = sVar55 * sVar82 + sVar140;
    uVar162 = sVar123 * sVar83 + sVar124;
    uVar168 = sVar128 * sVar84 + sVar129;
    uVar152 = sVar130 * sVar85 + sVar131;
    uVar158 = sVar132 * sVar86 + sVar133;
    uVar164 = sVar134 * sVar87 + sVar135;
    uVar170 = sVar136 * uVar99 + sVar137;
    uVar151 = uVar150 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar154 = sVar52 * uVar65 + sVar138;
    uVar160 = sVar55 * uVar111 + sVar140;
    uVar166 = sVar123 * uVar112 + sVar124;
    uVar172 = sVar128 * uVar115 + sVar129;
    uVar109 = sVar130 * uVar116 + sVar131;
    uVar113 = sVar132 * uVar119 + sVar133;
    uVar117 = sVar134 * uVar120 + sVar135;
    uVar121 = sVar136 * uVar142 + sVar137;
    uVar155 = uVar154 >> 8;
    uVar161 = uVar160 >> 8;
    uVar167 = uVar166 >> 8;
    uVar173 = uVar172 >> 8;
    uVar110 = uVar109 >> 8;
    uVar114 = uVar113 >> 8;
    uVar118 = uVar117 >> 8;
    uVar122 = uVar121 >> 8;
    puVar51[-0x10] = (uVar151 != 0) * (uVar151 < 0x100) * (char)(uVar150 >> 8) - (0xff < uVar151);
    puVar51[-0xf] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar51[-0xe] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar51[-0xd] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar51[-0xc] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar51[-0xb] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar51[-10] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar51[-9] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar51[-8] = (uVar155 != 0) * (uVar155 < 0x100) * (char)(uVar154 >> 8) - (0xff < uVar155);
    puVar51[-7] = (uVar161 != 0) * (uVar161 < 0x100) * (char)(uVar160 >> 8) - (0xff < uVar161);
    puVar51[-6] = (uVar167 != 0) * (uVar167 < 0x100) * (char)(uVar166 >> 8) - (0xff < uVar167);
    puVar51[-5] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    puVar51[-4] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar51[-3] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar51[-2] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar51[-1] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    uVar150 = sVar52 * uVar88 + sVar138;
    uVar156 = sVar55 * sVar89 + sVar140;
    uVar162 = sVar123 * sVar90 + sVar124;
    uVar168 = sVar128 * sVar91 + sVar129;
    uVar152 = sVar130 * sVar92 + sVar131;
    uVar158 = sVar132 * sVar93 + sVar133;
    uVar164 = sVar134 * sVar94 + sVar135;
    uVar170 = sVar136 * uVar101 + sVar137;
    uVar151 = uVar150 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar154 = sVar52 * uVar66 + sVar138;
    uVar160 = sVar55 * uVar143 + sVar140;
    uVar166 = sVar123 * uVar144 + sVar124;
    uVar172 = sVar128 * uVar145 + sVar129;
    uVar109 = sVar130 * uVar146 + sVar131;
    uVar113 = sVar132 * uVar147 + sVar133;
    uVar117 = sVar134 * uVar148 + sVar135;
    uVar121 = sVar136 * uVar149 + sVar137;
    uVar155 = uVar154 >> 8;
    uVar161 = uVar160 >> 8;
    uVar167 = uVar166 >> 8;
    uVar173 = uVar172 >> 8;
    uVar110 = uVar109 >> 8;
    uVar114 = uVar113 >> 8;
    uVar118 = uVar117 >> 8;
    uVar122 = uVar121 >> 8;
    *puVar51 = (uVar151 != 0) * (uVar151 < 0x100) * (char)(uVar150 >> 8) - (0xff < uVar151);
    puVar51[1] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar51[2] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar51[3] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar51[4] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar51[5] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar51[6] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar51[7] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar51[8] = (uVar155 != 0) * (uVar155 < 0x100) * (char)(uVar154 >> 8) - (0xff < uVar155);
    puVar51[9] = (uVar161 != 0) * (uVar161 < 0x100) * (char)(uVar160 >> 8) - (0xff < uVar161);
    puVar51[10] = (uVar167 != 0) * (uVar167 < 0x100) * (char)(uVar166 >> 8) - (0xff < uVar167);
    puVar51[0xb] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    puVar51[0xc] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar51[0xd] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar51[0xe] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar51[0xf] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar51 = puVar51 + stride;
  } while (uVar50 < 0xd0c0d0d);
  return;
}

Assistant:

void aom_smooth_v_predictor_64x32_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i bottom_left = _mm_set1_epi16(left_column[31]);
  const __m128i top_lolo = LoadUnaligned16(top_row);
  const __m128i top_lohi = LoadUnaligned16(top_row + 16);
  const __m128i top1 = cvtepu8_epi16(top_lolo);
  const __m128i top2 = _mm_unpackhi_epi8(top_lolo, zero);
  const __m128i top3 = cvtepu8_epi16(top_lohi);
  const __m128i top4 = _mm_unpackhi_epi8(top_lohi, zero);
  const __m128i top_hilo = LoadUnaligned16(top_row + 32);
  const __m128i top_hihi = LoadUnaligned16(top_row + 48);
  const __m128i top5 = cvtepu8_epi16(top_hilo);
  const __m128i top6 = _mm_unpackhi_epi8(top_hilo, zero);
  const __m128i top7 = cvtepu8_epi16(top_hihi);
  const __m128i top8 = _mm_unpackhi_epi8(top_hihi, zero);
  const __m128i weights_lo = LoadUnaligned16(smooth_weights + 28);
  const __m128i weights_hi = LoadUnaligned16(smooth_weights + 44);
  const __m128i weights1 = cvtepu8_epi16(weights_lo);
  const __m128i weights2 = _mm_unpackhi_epi8(weights_lo, zero);
  const __m128i weights3 = cvtepu8_epi16(weights_hi);
  const __m128i weights4 = _mm_unpackhi_epi8(weights_hi, zero);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_bottom_left1 =
      _mm_mullo_epi16(inverted_weights1, bottom_left);
  const __m128i scaled_bottom_left2 =
      _mm_mullo_epi16(inverted_weights2, bottom_left);
  const __m128i scaled_bottom_left3 =
      _mm_mullo_epi16(inverted_weights3, bottom_left);
  const __m128i scaled_bottom_left4 =
      _mm_mullo_epi16(inverted_weights4, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));

  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights1, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left1, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights2, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left2, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights3, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left3, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights4, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left4, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
}